

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking_hugeint.cpp
# Opt level: O2

void duckdb::HugeIntPacker::Unpack(uint32_t *in,uhugeint_t *out,bitpacking_width_t width)

{
  uint64_t *puVar1;
  uint32_t *puVar2;
  byte bVar3;
  undefined7 in_register_00000011;
  uhugeint_t *puVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  uint8_t i;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uhugeint_t uVar12;
  uhugeint_t local_c8;
  uint32_t *local_b8;
  uhugeint_t *local_b0;
  long local_a8;
  ulong local_a0;
  undefined8 local_98;
  uhugeint_t local_90;
  uhugeint_t *local_80;
  uhugeint_t local_78;
  ulong local_68;
  uhugeint_t local_60;
  uhugeint_t local_50;
  uhugeint_t local_40;
  
  local_98 = CONCAT71(in_register_00000011,width);
  local_b8 = in;
  local_b0 = out;
  switch((uint)local_98 << 0x1b | (uint)local_98 >> 5) {
  case 0:
    for (lVar7 = 0; lVar7 != 0x200; lVar7 = lVar7 + 0x10) {
      uhugeint_t::uhugeint_t(&local_c8,0);
      puVar1 = (uint64_t *)((long)&local_b0->lower + lVar7);
      *puVar1 = local_c8.lower;
      puVar1[1] = local_c8.upper;
    }
    break;
  case 1:
    for (lVar7 = 0; lVar7 != 0x80; lVar7 = lVar7 + 4) {
      uhugeint_t::uhugeint_t(&local_c8,(ulong)*(uint *)((long)local_b8 + lVar7));
      puVar1 = (uint64_t *)((long)&local_b0->lower + lVar7 * 4);
      *puVar1 = local_c8.lower;
      puVar1[1] = local_c8.upper;
    }
    break;
  case 2:
    for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 1) {
      uhugeint_t::uhugeint_t(&local_c8,(ulong)in[lVar7 * 2]);
      puVar4 = local_b0;
      local_b0->lower = local_c8.lower;
      local_b0->upper = local_c8.upper;
      uhugeint_t::uhugeint_t(&local_78,(ulong)in[lVar7 * 2 + 1]);
      uhugeint_t::uhugeint_t(&local_90,0x20);
      local_c8 = uhugeint_t::operator<<(&local_78,&local_90);
      uhugeint_t::operator|=(puVar4,&local_c8);
      local_b0 = puVar4 + 1;
    }
    break;
  case 3:
    for (lVar7 = 8; lVar7 != 0x188; lVar7 = lVar7 + 0xc) {
      uhugeint_t::uhugeint_t(&local_c8,(ulong)*(uint *)((long)in + lVar7 + -8));
      puVar4 = local_b0;
      local_b0->lower = local_c8.lower;
      local_b0->upper = local_c8.upper;
      uhugeint_t::uhugeint_t(&local_78,(ulong)*(uint *)((long)in + lVar7 + -4));
      uhugeint_t::uhugeint_t(&local_90,0x20);
      local_c8 = uhugeint_t::operator<<(&local_78,&local_90);
      uhugeint_t::operator|=(puVar4,&local_c8);
      uhugeint_t::uhugeint_t(&local_78,(ulong)*(uint *)((long)in + lVar7));
      uhugeint_t::uhugeint_t(&local_90,0x40);
      local_c8 = uhugeint_t::operator<<(&local_78,&local_90);
      uhugeint_t::operator|=(puVar4,&local_c8);
      local_b0 = puVar4 + 1;
    }
    break;
  case 4:
    for (lVar7 = 0; lVar7 != 0x200; lVar7 = lVar7 + 0x10) {
      uhugeint_t::uhugeint_t(&local_c8,(ulong)*(uint *)((long)in + lVar7));
      puVar4 = (uhugeint_t *)((long)&local_b0->lower + lVar7);
      puVar1 = (uint64_t *)((long)&local_b0->lower + lVar7);
      *puVar1 = local_c8.lower;
      puVar1[1] = local_c8.upper;
      uhugeint_t::uhugeint_t(&local_78,(ulong)*(uint *)((long)in + lVar7 + 4));
      uhugeint_t::uhugeint_t(&local_90,0x20);
      local_c8 = uhugeint_t::operator<<(&local_78,&local_90);
      uhugeint_t::operator|=(puVar4,&local_c8);
      uhugeint_t::uhugeint_t(&local_78,(ulong)*(uint *)((long)in + lVar7 + 8));
      uhugeint_t::uhugeint_t(&local_90,0x40);
      local_c8 = uhugeint_t::operator<<(&local_78,&local_90);
      uhugeint_t::operator|=(puVar4,&local_c8);
      uhugeint_t::uhugeint_t(&local_78,(ulong)*(uint *)((long)in + lVar7 + 0xc));
      uhugeint_t::uhugeint_t(&local_90,0x60);
      local_c8 = uhugeint_t::operator<<(&local_78,&local_90);
      uhugeint_t::operator|=(puVar4,&local_c8);
    }
    break;
  default:
    local_a0 = (ulong)width;
    lVar7 = 0;
    for (lVar5 = 0; puVar4 = local_b0, puVar2 = local_b8, lVar5 != 0x1f0; lVar5 = lVar5 + 0x10) {
      uVar6 = (uint)lVar7;
      uVar9 = uVar6 & 0x1f;
      uVar10 = uVar9 + (int)local_98;
      if (uVar10 < 0x20) {
        uhugeint_t::uhugeint_t(&local_78,(ulong)*local_b8);
        uhugeint_t::uhugeint_t(&local_90,(ulong)(uVar6 & 0x1f));
        local_c8 = uhugeint_t::operator>>(&local_78,&local_90);
        uhugeint_t::uhugeint_t(&local_40,1);
        uVar11 = local_a0;
        uhugeint_t::uhugeint_t(&local_50,local_a0);
        local_60 = uhugeint_t::operator<<(&local_40,&local_50);
        uVar12 = uhugeint_t::operator%(&local_c8,&local_60);
        *(uint64_t *)((long)&local_b0->lower + lVar5) = uVar12.lower;
        *(uint64_t *)((long)&local_b0->upper + lVar5) = uVar12.upper;
      }
      else {
        local_80 = (uhugeint_t *)((long)&local_b0->lower + lVar5);
        bVar3 = (byte)uVar10;
        local_a8 = lVar7;
        if (uVar10 < 0x40) {
          uhugeint_t::uhugeint_t(&local_c8,(ulong)*local_b8);
          uhugeint_t::uhugeint_t(&local_78,(ulong)((uint)local_a8 & 0x1f));
          uVar12 = uhugeint_t::operator>>(&local_c8,&local_78);
          *(uint64_t *)((long)&local_b0->lower + lVar5) = uVar12.lower;
          *(uint64_t *)((long)&local_b0->upper + lVar5) = uVar12.upper;
          local_b8 = puVar2 + 1;
          lVar7 = local_a8;
          uVar11 = local_a0;
          if (uVar10 != 0x20) {
            uhugeint_t::uhugeint_t(&local_78,(ulong)(~(-1 << (bVar3 & 0x1f)) & *local_b8));
            uhugeint_t::uhugeint_t(&local_90,(ulong)(0x20 - uVar9));
            local_c8 = uhugeint_t::operator<<(&local_78,&local_90);
            uhugeint_t::operator|=(local_80,&local_c8);
            lVar7 = local_a8;
            uVar11 = local_a0;
          }
        }
        else if (uVar10 < 0x60) {
          uhugeint_t::uhugeint_t(&local_c8,(ulong)*local_b8);
          uhugeint_t::uhugeint_t(&local_78,(ulong)((uint)local_a8 & 0x1f));
          uVar12 = uhugeint_t::operator>>(&local_c8,&local_78);
          *(uint64_t *)((long)&puVar4->lower + lVar5) = uVar12.lower;
          *(uint64_t *)((long)&puVar4->upper + lVar5) = uVar12.upper;
          uhugeint_t::uhugeint_t(&local_78,(ulong)puVar2[1]);
          uhugeint_t::uhugeint_t(&local_90,(ulong)(0x20 - uVar9));
          local_c8 = uhugeint_t::operator<<(&local_78,&local_90);
          uhugeint_t::operator|=(local_80,&local_c8);
          local_b8 = puVar2 + 2;
          lVar7 = local_a8;
          uVar11 = local_a0;
          if (uVar10 != 0x40) {
            uhugeint_t::uhugeint_t(&local_78,(ulong)(~(-1 << (bVar3 & 0x1f)) & *local_b8));
            uhugeint_t::uhugeint_t(&local_90,(ulong)(0x40 - uVar9));
            local_c8 = uhugeint_t::operator<<(&local_78,&local_90);
            uhugeint_t::operator|=(local_80,&local_c8);
            lVar7 = local_a8;
            uVar11 = local_a0;
          }
        }
        else {
          local_68 = (ulong)(0x20 - uVar9);
          if (uVar10 < 0x80) {
            uhugeint_t::uhugeint_t(&local_c8,(ulong)*local_b8);
            uhugeint_t::uhugeint_t(&local_78,(ulong)(uVar6 & 0x1f));
            uVar12 = uhugeint_t::operator>>(&local_c8,&local_78);
            *(uint64_t *)((long)&local_b0->lower + lVar5) = uVar12.lower;
            *(uint64_t *)((long)&local_b0->upper + lVar5) = uVar12.upper;
            uhugeint_t::uhugeint_t(&local_78,(ulong)puVar2[1]);
            uhugeint_t::uhugeint_t(&local_90,local_68);
            local_c8 = uhugeint_t::operator<<(&local_78,&local_90);
            puVar4 = local_80;
            uhugeint_t::operator|=(local_80,&local_c8);
            uhugeint_t::uhugeint_t(&local_78,(ulong)puVar2[2]);
            uhugeint_t::uhugeint_t(&local_90,(ulong)(0x40 - uVar9));
            local_c8 = uhugeint_t::operator<<(&local_78,&local_90);
            uhugeint_t::operator|=(puVar4,&local_c8);
            local_b8 = puVar2 + 3;
            lVar7 = local_a8;
            uVar11 = local_a0;
            if (uVar10 != 0x60) {
              uhugeint_t::uhugeint_t(&local_78,(ulong)(~(-1 << (bVar3 & 0x1f)) & *local_b8));
              uhugeint_t::uhugeint_t(&local_90,(ulong)(0x60 - uVar9));
              local_c8 = uhugeint_t::operator<<(&local_78,&local_90);
LAB_01a26f48:
              uhugeint_t::operator|=(puVar4,&local_c8);
              lVar7 = local_a8;
              uVar11 = local_a0;
            }
          }
          else {
            uhugeint_t::uhugeint_t(&local_c8,(ulong)*local_b8);
            local_b8 = puVar2;
            uhugeint_t::uhugeint_t(&local_78,(ulong)(uVar6 & 0x1f));
            uVar12 = uhugeint_t::operator>>(&local_c8,&local_78);
            *(uint64_t *)((long)&local_b0->lower + lVar5) = uVar12.lower;
            *(uint64_t *)((long)&local_b0->upper + lVar5) = uVar12.upper;
            uhugeint_t::uhugeint_t(&local_78,(ulong)local_b8[1]);
            uhugeint_t::uhugeint_t(&local_90,local_68);
            local_c8 = uhugeint_t::operator<<(&local_78,&local_90);
            puVar4 = local_80;
            uhugeint_t::operator|=(local_80,&local_c8);
            uhugeint_t::uhugeint_t(&local_78,(ulong)local_b8[2]);
            uhugeint_t::uhugeint_t(&local_90,(ulong)(0x40 - uVar9));
            local_c8 = uhugeint_t::operator<<(&local_78,&local_90);
            uhugeint_t::operator|=(puVar4,&local_c8);
            uhugeint_t::uhugeint_t(&local_78,(ulong)local_b8[3]);
            uhugeint_t::uhugeint_t(&local_90,(ulong)(0x60 - uVar9));
            puVar2 = local_b8;
            local_c8 = uhugeint_t::operator<<(&local_78,&local_90);
            uhugeint_t::operator|=(puVar4,&local_c8);
            local_b8 = puVar2 + 4;
            lVar7 = local_a8;
            uVar11 = local_a0;
            if (uVar10 != 0x80) {
              uhugeint_t::uhugeint_t(&local_78,(ulong)(~(-1 << (bVar3 & 0x1f)) & *local_b8));
              uhugeint_t::uhugeint_t(&local_90,(ulong)(0x80 - uVar9));
              local_c8 = uhugeint_t::operator<<(&local_78,&local_90);
              puVar4 = local_80;
              goto LAB_01a26f48;
            }
          }
        }
      }
      lVar7 = lVar7 + uVar11;
    }
    bVar3 = (byte)local_98;
    uhugeint_t::uhugeint_t(&local_c8,(ulong)(*local_b8 >> (-bVar3 & 0x1f)));
    puVar4[0x1f].lower = local_c8.lower;
    puVar4[0x1f].upper = local_c8.upper;
    if (0x20 < bVar3) {
      bVar8 = -bVar3 & 0x1f;
      puVar4 = local_b0 + 0x1f;
      uhugeint_t::uhugeint_t(&local_78,(ulong)local_b8[1]);
      uhugeint_t::uhugeint_t(&local_90,(ulong)(0x20 - bVar8));
      local_c8 = uhugeint_t::operator<<(&local_78,&local_90);
      uhugeint_t::operator|=(puVar4,&local_c8);
      if (0x40 < bVar3) {
        uhugeint_t::uhugeint_t(&local_78,(ulong)local_b8[2]);
        uhugeint_t::uhugeint_t(&local_90,(ulong)(0x40 - bVar8));
        local_c8 = uhugeint_t::operator<<(&local_78,&local_90);
        uhugeint_t::operator|=(puVar4,&local_c8);
        if (0x60 < bVar3) {
          uhugeint_t::uhugeint_t(&local_78,(ulong)local_b8[3]);
          uhugeint_t::uhugeint_t(&local_90,(ulong)(0x60 - bVar8));
          local_c8 = uhugeint_t::operator<<(&local_78,&local_90);
          uhugeint_t::operator|=(puVar4,&local_c8);
        }
      }
    }
  }
  return;
}

Assistant:

void HugeIntPacker::Unpack(const uint32_t *__restrict in, uhugeint_t *__restrict out, bitpacking_width_t width) {
	D_ASSERT(width <= 128);
	switch (width) {
	case 0:
		UnpackDelta0(in, out);
		break;
	case 32:
		UnpackDelta32(in, out);
		break;
	case 64:
		UnpackDelta64(in, out);
		break;
	case 96:
		UnpackDelta96(in, out);
		break;
	case 128:
		UnpackDelta128(in, out);
		break;
	default:
		for (idx_t oindex = 0; oindex < BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE - 1; ++oindex) {
			UnpackSingle(in, out + oindex, width,
			             (width * oindex) % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE);
		}
		UnpackLast(in, out, width);
	}
}